

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test6(void)

{
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  int *x;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> v2;
  int local_60;
  int i_3;
  undefined1 local_58 [4];
  int i_2;
  vector<int,_std::allocator<int>_> v1;
  int i_1;
  int local_30;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  Queue q;
  
  CP::queue<int>::queue((queue<int> *)local_28);
  for (local_2c = 0; local_2c < 1000; local_2c = local_2c + 1) {
    local_30 = local_2c * 2;
    CP::queue<int>::push((queue<int> *)local_28,&local_30);
  }
  for (v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (int)v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage < 200;
      v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage + 1) {
    CP::queue<int>::pop((queue<int> *)local_28);
  }
  CP::queue<int>::to_vector
            ((vector<int,_std::allocator<int>_> *)local_58,(queue<int> *)local_28,200);
  for (i_3 = 0; i_3 < 1000; i_3 = i_3 + 1) {
    local_60 = i_3 * 0x14;
    CP::queue<int>::push((queue<int> *)local_28,&local_60);
  }
  for (v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < 300;
      v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    CP::queue<int>::pop((queue<int> *)local_28);
  }
  CP::queue<int>::to_vector
            ((vector<int,_std::allocator<int>_> *)&__range1,(queue<int> *)local_28,0x514);
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)&__range1);
  x = (int *)std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &x);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar3," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
  CP::queue<int>::~queue((queue<int> *)local_28);
  return true;
}

Assistant:

bool test6() {
  Queue q;
  for (int i = 0;i < 1000;i++)
    q.push(i*2);
  for (int i = 0;i < 200;i++) q.pop();
  vector<int> v1 = q.to_vector(200);
  for (int i = 0;i < 1000;i++)
    q.push(i*20);
  for (int i = 0;i < 300;i++) q.pop();
  vector<int> v2 = q.to_vector(1300);
  for (auto &x : v2) {
    cout << x << " ";
  }
  cout << endl;
  return true;
}